

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  stbi_uc **ppsVar1;
  uint uVar2;
  stbi__context *s;
  stbi__context *psVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  stbi_uc sVar7;
  byte bVar8;
  byte bVar9;
  stbi_uc sVar10;
  stbi__uint32 sVar11;
  stbi__uint32 sVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  int depth;
  int iVar18;
  stbi_uc *psVar19;
  char *pcVar20;
  size_t sVar21;
  stbi_uc *psVar22;
  uint uVar23;
  ulong uVar24;
  uint uVar25;
  stbi__uint16 *tc_00;
  ulong uVar26;
  uint uVar27;
  int out_n;
  stbi__png *z_00;
  byte bVar28;
  long lVar29;
  uint uVar30;
  uint uVar31;
  long lVar32;
  stbi_uc *psVar33;
  long in_FS_OFFSET;
  stbi_uc tc [3];
  ulong local_4d8;
  stbi__uint32 local_490;
  stbi__uint32 raw_len;
  ulong local_460;
  stbi_uc *local_458;
  stbi__uint16 tc16 [3];
  stbi_uc palette [1024];
  
  tc[2] = '\0';
  tc[0] = '\0';
  tc[1] = '\0';
  s = z->s;
  ppsVar1 = &z->idata;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  lVar32 = 0;
  do {
    sVar7 = stbi__get8(s);
    if (sVar7 != (&stbi__check_png_header_png_sig)[lVar32]) {
      pcVar20 = "Not a PNG";
      goto LAB_0018715d;
    }
    lVar32 = lVar32 + 1;
  } while (lVar32 != 8);
  if (scan == 1) {
    return 1;
  }
  bVar4 = true;
  bVar8 = 0;
  uVar30 = 0;
  bVar5 = false;
  local_4d8 = 0;
  uVar13 = 0;
  uVar31 = 0;
  bVar6 = false;
  bVar28 = 0;
  do {
    sVar11 = stbi__get32be(s);
    sVar12 = stbi__get32be(s);
    if ((int)sVar12 < 0x49484452) {
      if (sVar12 == 0x43674249) {
        bVar5 = true;
      }
      else {
        if (sVar12 == 0x49444154) {
          if ((!bVar4) && ((bVar28 == 0 || ((uint)local_4d8 != 0)))) {
            if (scan == 2) {
              if (bVar28 != 0) {
                s->img_n = (uint)bVar28;
                return 1;
              }
              return 1;
            }
            if (0x40000000 < sVar11) {
              pcVar20 = "IDAT section larger than 2^30 bytes";
              goto LAB_0018715d;
            }
            uVar14 = uVar31 + sVar11;
            if ((int)uVar14 < (int)uVar31) {
              return 0;
            }
            if (uVar13 < uVar14) {
              uVar24 = (ulong)sVar11;
              if (sVar11 < 0x1001) {
                uVar24 = 0x1000;
              }
              if (uVar13 != 0) {
                uVar24 = (ulong)uVar13;
              }
              do {
                sVar21 = uVar24;
                uVar13 = (uint)sVar21;
                uVar24 = (ulong)(uVar13 * 2);
              } while (uVar13 < uVar14);
              psVar19 = (stbi_uc *)realloc(*ppsVar1,sVar21);
              if (psVar19 == (stbi_uc *)0x0) goto LAB_0018763c;
              *ppsVar1 = psVar19;
            }
            else {
              psVar19 = *ppsVar1;
            }
            iVar15 = stbi__getn(s,psVar19 + uVar31,sVar11);
            uVar31 = uVar14;
            bVar4 = false;
            if (iVar15 != 0) goto LAB_00186f54;
          }
          goto LAB_00187156;
        }
        if (sVar12 == 0x49454e44) {
          if (!bVar4) {
            if (scan != 0) {
              return 1;
            }
            if (*ppsVar1 != (stbi_uc *)0x0) {
              raw_len = s->img_n * s->img_y * (z->depth * s->img_x + 7 >> 3) + s->img_y;
              psVar19 = (stbi_uc *)
                        stbi_zlib_decode_malloc_guesssize_headerflag
                                  ((char *)*ppsVar1,uVar31,raw_len,(int *)&raw_len,(uint)!bVar5);
              z->expanded = psVar19;
              if (psVar19 == (stbi_uc *)0x0) {
                return 0;
              }
              free(z->idata);
              z->idata = (stbi_uc *)0x0;
              iVar15 = s->img_n + 1;
              iVar16 = s->img_n;
              if (bVar6) {
                iVar16 = iVar15;
              }
              out_n = iVar16;
              if (req_comp != 3) {
                out_n = iVar15;
              }
              if (bVar28 != 0) {
                out_n = iVar16;
              }
              if (iVar15 != req_comp) {
                out_n = iVar16;
              }
              s->img_out_n = out_n;
              uVar31 = z->depth;
              local_460 = (ulong)uVar31;
              iVar15 = out_n << (uVar31 == 0x10);
              sVar11 = z->s->img_x;
              sVar12 = z->s->img_y;
              if (bVar8 == 0) {
                iVar15 = stbi__create_png_image_raw
                                   (z,z->expanded,raw_len,out_n,sVar11,sVar12,uVar31,uVar30);
                if (iVar15 == 0) {
                  return 0;
                }
              }
              else {
                local_490 = raw_len;
                local_458 = z->expanded;
                psVar19 = (stbi_uc *)stbi__malloc_mad3(sVar11,sVar12,iVar15,0);
                if (psVar19 == (stbi_uc *)0x0) goto LAB_0018763c;
                sVar21 = (size_t)iVar15;
                lVar32 = 0;
                do {
                  psVar3 = z->s;
                  uVar31 = (&DAT_001ba020)[lVar32];
                  uVar13 = (&DAT_001ba060)[lVar32];
                  uVar25 = ~uVar31 + psVar3->img_x + uVar13;
                  uVar27 = uVar25 / uVar13;
                  uVar14 = (&DAT_001ba040)[lVar32];
                  uVar2 = (&DAT_001ba080)[lVar32];
                  uVar23 = ~uVar14 + psVar3->img_y + uVar2;
                  uVar17 = uVar23 / uVar2;
                  if ((uVar13 <= uVar25) && (uVar2 <= uVar23)) {
                    depth = (int)local_460;
                    iVar16 = psVar3->img_n;
                    iVar18 = stbi__create_png_image_raw
                                       (z,local_458,local_490,out_n,uVar27,uVar17,depth,uVar30);
                    if (iVar18 == 0) {
                      free(psVar19);
                      return 0;
                    }
                    if (0 < (int)uVar17) {
                      iVar18 = uVar14 * iVar15;
                      local_4d8 = 0;
                      do {
                        if (0 < (int)uVar27) {
                          psVar22 = z->out;
                          psVar33 = psVar19 + (ulong)(z->s->img_x * iVar18) +
                                              (long)(int)uVar31 * sVar21;
                          lVar29 = 0;
                          do {
                            memcpy(psVar33,psVar22 + (local_4d8 * (long)(int)uVar27 + lVar29) *
                                                     sVar21,sVar21);
                            lVar29 = lVar29 + 1;
                            psVar33 = psVar33 + (long)(int)uVar13 * sVar21;
                          } while (lVar29 < (int)uVar27);
                        }
                        local_4d8 = local_4d8 + 1;
                        iVar18 = iVar18 + uVar2 * iVar15;
                      } while (local_4d8 < uVar17);
                    }
                    uVar17 = (((int)(uVar27 * depth * iVar16 + 7) >> 3) + 1) * uVar17;
                    free(z->out);
                    local_458 = local_458 + uVar17;
                    local_490 = local_490 - uVar17;
                  }
                  lVar32 = lVar32 + 1;
                } while (lVar32 != 7);
                z->out = psVar19;
              }
              if (bVar6) {
                z_00 = (stbi__png *)(ulong)z->s->img_x;
                tc_00 = (stbi__uint16 *)(ulong)z->s->img_y;
                iVar15 = (int)z->out;
                if (z->depth == 0x10) {
                  stbi__compute_transparency16(z_00,tc_00,iVar15);
                }
                else {
                  stbi__compute_transparency(z_00,(stbi_uc *)tc_00,iVar15);
                }
              }
              if (bVar5) {
                iVar15 = stbi__de_iphone_flag_global;
                if (*(int *)(in_FS_OFFSET + -4) != 0) {
                  iVar15 = *(int *)(in_FS_OFFSET + -8);
                }
                if ((iVar15 != 0) && (2 < s->img_out_n)) {
                  stbi__de_iphone((stbi__png *)z->s);
                }
              }
              if (bVar28 == 0) {
                if (bVar6) {
                  s->img_n = s->img_n + 1;
                }
LAB_00187687:
                free(z->expanded);
                z->expanded = (stbi_uc *)0x0;
                stbi__get32be(s);
                return 1;
              }
              s->img_n = (uint)bVar28;
              uVar30 = (uint)bVar28;
              if (2 < req_comp) {
                uVar30 = req_comp;
              }
              s->img_out_n = uVar30;
              psVar19 = z->out;
              uVar31 = z->s->img_y * z->s->img_x;
              psVar22 = (stbi_uc *)stbi__malloc_mad2(uVar31,uVar30,0);
              if (psVar22 != (stbi_uc *)0x0) {
                if (uVar30 == 3) {
                  if (uVar31 != 0) {
                    uVar24 = 0;
                    psVar33 = psVar22;
                    do {
                      uVar26 = (ulong)psVar19[uVar24];
                      *psVar33 = palette[uVar26 * 4];
                      psVar33[1] = palette[uVar26 * 4 + 1];
                      psVar33[2] = palette[uVar26 * 4 + 2];
                      psVar33 = psVar33 + 3;
                      uVar24 = uVar24 + 1;
                    } while (uVar31 != uVar24);
                  }
                }
                else if (uVar31 != 0) {
                  uVar24 = 0;
                  do {
                    *(undefined4 *)(psVar22 + uVar24 * 4) =
                         *(undefined4 *)(palette + (ulong)psVar19[uVar24] * 4);
                    uVar24 = uVar24 + 1;
                  } while (uVar31 != uVar24);
                }
                free(psVar19);
                z->out = psVar22;
                goto LAB_00187687;
              }
LAB_0018763c:
              pcVar20 = "Out of memory";
              goto LAB_0018715d;
            }
          }
LAB_00187156:
          pcVar20 = "Corrupt PNG";
LAB_0018715d:
          *(char **)(in_FS_OFFSET + -0x20) = pcVar20;
          return 0;
        }
LAB_00186f31:
        if (bVar4) goto LAB_00187156;
        bVar4 = false;
        if ((sVar12 >> 0x1d & 1) == 0) {
          pcVar20 = "PNG not supported: unknown PNG chunk type";
          goto LAB_0018715d;
        }
      }
      stbi__skip(s,sVar11);
    }
    else if (sVar12 == 0x74524e53) {
      if ((bVar4) || (*ppsVar1 != (stbi_uc *)0x0)) goto LAB_00187156;
      if (bVar28 == 0) {
        uVar14 = s->img_n;
        if (((uVar14 & 1) == 0) || (uVar14 * 2 != sVar11)) goto LAB_00187156;
        if (scan == 2) {
          s->img_n = uVar14 + 1;
          return 1;
        }
        if (z->depth == 0x10) {
          if (0 < (int)uVar14) {
            uVar24 = 0;
            do {
              sVar7 = stbi__get8(s);
              sVar10 = stbi__get8(s);
              tc16[uVar24] = CONCAT11(sVar7,sVar10);
              if (1 < uVar24) break;
              uVar24 = uVar24 + 1;
            } while ((long)uVar24 < (long)s->img_n);
          }
        }
        else if (0 < (int)uVar14) {
          uVar24 = 0;
          do {
            stbi__get8(s);
            sVar7 = stbi__get8(s);
            tc[uVar24] = ""[z->depth] * sVar7;
            if (1 < uVar24) break;
            uVar24 = uVar24 + 1;
          } while ((long)uVar24 < (long)s->img_n);
        }
        bVar6 = true;
        bVar28 = 0;
        bVar4 = false;
      }
      else {
        if (scan == 2) {
          s->img_n = 4;
          return 1;
        }
        if (((uint)local_4d8 == 0) || ((uint)local_4d8 < sVar11)) goto LAB_00187156;
        bVar28 = 4;
        bVar4 = false;
        if (sVar11 != 0) {
          uVar24 = 0;
          do {
            sVar7 = stbi__get8(s);
            palette[uVar24 * 4 + 3] = sVar7;
            uVar24 = uVar24 + 1;
            bVar4 = false;
          } while (sVar11 != uVar24);
        }
      }
    }
    else if (sVar12 == 0x504c5445) {
      if (((bVar4) || (0x300 < sVar11)) ||
         (uVar14 = (sVar11 & 0xffff) / 3, local_4d8 = (ulong)uVar14, uVar14 * 3 != sVar11))
      goto LAB_00187156;
      bVar4 = false;
      if (2 < sVar11) {
        uVar24 = 0;
        do {
          sVar7 = stbi__get8(s);
          palette[uVar24 * 4] = sVar7;
          sVar7 = stbi__get8(s);
          palette[uVar24 * 4 + 1] = sVar7;
          sVar7 = stbi__get8(s);
          palette[uVar24 * 4 + 2] = sVar7;
          palette[uVar24 * 4 + 3] = 0xff;
          uVar24 = uVar24 + 1;
        } while (local_4d8 != uVar24);
      }
    }
    else {
      if (sVar12 != 0x49484452) goto LAB_00186f31;
      if ((!bVar4) || (sVar11 != 0xd)) goto LAB_00187156;
      sVar11 = stbi__get32be(s);
      s->img_x = sVar11;
      sVar11 = stbi__get32be(s);
      s->img_y = sVar11;
      if ((0x1000000 < sVar11) || (0x1000000 < s->img_x)) {
        pcVar20 = "Very large image (corrupt?)";
        goto LAB_0018715d;
      }
      bVar8 = stbi__get8(s);
      z->depth = (uint)bVar8;
      if ((0x10 < bVar8) || ((0x10116U >> (bVar8 & 0x1f) & 1) == 0)) {
        pcVar20 = "PNG not supported: 1/2/4/8/16-bit only";
        goto LAB_0018715d;
      }
      bVar9 = stbi__get8(s);
      if (6 < bVar9) goto LAB_00187156;
      uVar30 = (uint)bVar9;
      if (bVar9 == 3) {
        bVar28 = 3;
        if (z->depth == 0x10) goto LAB_00187156;
      }
      else if ((bVar9 & 1) != 0) goto LAB_00187156;
      sVar7 = stbi__get8(s);
      if ((((sVar7 != '\0') || (sVar7 = stbi__get8(s), sVar7 != '\0')) ||
          (bVar8 = stbi__get8(s), 1 < bVar8)) ||
         ((uVar14 = s->img_x, uVar14 == 0 || (uVar2 = s->img_y, uVar2 == 0)))) goto LAB_00187156;
      if (bVar28 == 0) {
        uVar27 = (uint)(3 < bVar9) + (bVar9 & 2) + 1;
        s->img_n = uVar27;
        bVar28 = 0;
        bVar4 = false;
        if ((uint)((0x40000000 / (ulong)uVar14) / (ulong)uVar27) < uVar2) {
          pcVar20 = "Image too large to decode";
          goto LAB_0018715d;
        }
      }
      else {
        s->img_n = 1;
        bVar4 = false;
        if ((uint)(0x40000000 / (ulong)uVar14 >> 2) < uVar2) goto LAB_00187156;
      }
    }
LAB_00186f54:
    stbi__get32be(s);
  } while( true );
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3]={0};
   stbi__uint16 tc16[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s);
            s->img_y = stbi__get32be(s);
            if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            z->depth = stbi__get8(s);  if (z->depth != 1 && z->depth != 2 && z->depth != 4 && z->depth != 8 && z->depth != 16)  return stbi__err("1/2/4/8/16-bit only","PNG not supported: 1/2/4/8/16-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3 && z->depth == 16)                  return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
            }
            // even with SCAN_header, have to scan to see if we have a tRNS
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               // non-paletted with tRNS = constant alpha. if header-scanning, we can stop now.
               if (scan == STBI__SCAN_header) { ++s->img_n; return 1; }
               if (z->depth == 16) {
                  for (k = 0; k < s->img_n && k < 3; ++k) // extra loop test to suppress false GCC warning
                     tc16[k] = (stbi__uint16)stbi__get16be(s); // copy the values as-is
               } else {
                  for (k = 0; k < s->img_n && k < 3; ++k)
                     tc[k] = (stbi_uc)(stbi__get16be(s) & 255) * stbi__depth_scale_table[z->depth]; // non 8-bit images will be larger
               }
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) {
               // header scan definitely stops at first IDAT
               if (pal_img_n)
                  s->img_n = pal_img_n;
               return 1;
            }
            if (c.length > (1u << 30)) return stbi__err("IDAT size limit", "IDAT section larger than 2^30 bytes");
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi__uint32 idata_limit_old = idata_limit;
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               STBI_NOTUSED(idata_limit_old);
               p = (stbi_uc *) STBI_REALLOC_SIZED(z->idata, idata_limit_old, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * z->depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, z->depth, color, interlace)) return 0;
            if (has_trans) {
               if (z->depth == 16) {
                  if (!stbi__compute_transparency16(z, tc16, s->img_out_n)) return 0;
               } else {
                  if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
               }
            }
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            } else if (has_trans) {
               // non-paletted image with tRNS -> source image has (constant) alpha
               ++s->img_n;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            // end of PNG chunk, read and skip CRC
            stbi__get32be(s);
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}